

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void duckdb::TemplatedWritePlain<long,long,duckdb::ParquetTimestampNSOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long lVar1;
  long lVar2;
  idx_t iVar3;
  
  lVar1 = *(long *)(col + 0x20);
  for (iVar3 = chunk_start; iVar3 < chunk_end; iVar3 = iVar3 + 1) {
    ser = *(WriteStream **)(lVar1 + iVar3 * 8);
    if ((long)ser < (long)stats[1]._vptr_ColumnWriterStatistics) {
      stats[1]._vptr_ColumnWriterStatistics = (_func_int **)ser;
    }
    if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)ser) {
      stats[2]._vptr_ColumnWriterStatistics = (_func_int **)ser;
    }
  }
  lVar2 = (chunk_end - chunk_start) * 8;
  (*(code *)**(undefined8 **)mask)(mask,lVar1 + chunk_start * 8,lVar2,lVar2,mask,ser);
  return;
}

Assistant:

static inline data_ptr_t GetData(Vector &vector) {
		D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR ||
		         vector.GetVectorType() == VectorType::FLAT_VECTOR);
		return vector.data;
	}